

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densematrix.cc
# Opt level: O2

void __thiscall fasttext::DenseMatrix::addRowToVector(DenseMatrix *this,Vector *x,int32_t i)

{
  pointer pfVar1;
  pointer pfVar2;
  uint __line;
  int64_t iVar3;
  real *prVar4;
  char *__assertion;
  int64_t j;
  long j_00;
  
  if (i < 0) {
    __assertion = "i >= 0";
    __line = 0x70;
  }
  else {
    iVar3 = Matrix::size(&this->super_Matrix,0);
    if ((long)(ulong)(uint)i < iVar3) {
      pfVar1 = (x->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pfVar2 = (x->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar3 = Matrix::size(&this->super_Matrix,1);
      if ((long)pfVar1 - (long)pfVar2 >> 2 == iVar3) {
        j_00 = 0;
        while( true ) {
          iVar3 = Matrix::size(&this->super_Matrix,1);
          if (iVar3 <= j_00) break;
          prVar4 = at(this,(ulong)(uint)i,j_00);
          pfVar1 = (x->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pfVar1[j_00] = *prVar4 + pfVar1[j_00];
          j_00 = j_00 + 1;
        }
        return;
      }
      __assertion = "x.size() == this->size(1)";
      __line = 0x72;
    }
    else {
      __assertion = "i < this->size(0)";
      __line = 0x71;
    }
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/tshev[P]faster-FastText/src/densematrix.cc"
                ,__line,
                "virtual void fasttext::DenseMatrix::addRowToVector(Vector &, int32_t) const");
}

Assistant:

void DenseMatrix::addRowToVector(Vector& x, int32_t i) const {
  assert(i >= 0);
  assert(i < this->size(0));
  assert(x.size() == this->size(1));
  for (int64_t j = 0; j < this->size(1); j++) {
    x[j] += at(i, j);
  }
}